

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::ArrayComparisonTest<const_unsigned_int,_const_unsigned_int>::ArrayComparisonTest
          (ArrayComparisonTest<const_unsigned_int,_const_unsigned_int> *this,
          initializer_list<const_unsigned_int> left,initializer_list<const_unsigned_int> right,
          TestOrdering expectedResult)

{
  kj *this_00;
  kj *end;
  
  this_00 = (kj *)right._M_array;
  end = this_00;
  heapArray<unsigned_int_const,unsigned_int_const*>
            (&this->left,(kj *)left._M_array,(uint *)((kj *)left._M_array + left._M_len * 4),
             (uint *)this_00);
  heapArray<unsigned_int_const,unsigned_int_const*>
            (&this->right,this_00,(uint *)(this_00 + right._M_len * 4),(uint *)end);
  this->expectedResult = expectedResult;
  return;
}

Assistant:

ArrayComparisonTest(std::initializer_list<A> left, std::initializer_list<B> right, TestOrdering expectedResult) :
    left(heapArray(left)), right(heapArray(right)), expectedResult(expectedResult) {}